

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void VW::add_constant_feature(vw *vw,example *ec)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sStack_28;
  
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec,&constant_namespace);
  features::push_back((ec->super_example_predict).feature_space + 0x80,1.0,0xb1c55c);
  ec->total_sum_feat_sq = ec->total_sum_feat_sq + 1.0;
  ec->num_features = ec->num_features + 1;
  if ((vw->audit != false) || (vw->hash_inv == true)) {
    this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)operator_new(0x40);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[1],_const_char_(&)[9],_true>
              (this,(char (*) [1])0x238859,(char (*) [9])"Constant");
    std::
    __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
              ((__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                *)&sStack_28,this);
    v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&(ec->super_example_predict).feature_space[0x80].space_names,&sStack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_28.
                super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

void add_constant_feature(vw& vw, example* ec)
{
  ec->indices.push_back(constant_namespace);
  ec->feature_space[constant_namespace].push_back(1, constant);
  ec->total_sum_feat_sq++;
  ec->num_features++;
  if (vw.audit || vw.hash_inv)
    ec->feature_space[constant_namespace].space_names.push_back(audit_strings_ptr(new audit_strings("", "Constant")));
}